

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolynomialEvaluation.cpp
# Opt level: O3

PolyNf * __thiscall
Inferences::PolynomialEvaluation::simplifySummation<Kernel::NumTraits<Kernel::IntegerConstantType>>
          (PolyNf *__return_storage_ptr__,PolynomialEvaluation *this,
          Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> *summands,
          bool removeZeros)

{
  Entry *pEVar1;
  long lVar2;
  DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
  *pDVar3;
  long lVar4;
  int iVar5;
  RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
  *pRVar6;
  bool bVar7;
  int iVar8;
  ulong uVar9;
  undefined7 in_register_00000009;
  Entry *pEVar10;
  Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *r;
  Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *pMVar11;
  __mpz_struct *u;
  anon_class_16_2_f84bbffd_conflict f;
  Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> monom;
  Numeral numeral;
  int local_100;
  char local_fc;
  Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_> local_f8;
  RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
  *local_d8;
  Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *local_d0;
  __mpz_struct local_c8;
  int local_b8;
  undefined4 uStack_b4;
  Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *pMStack_b0;
  uint local_a8 [4];
  __mpz_struct local_98;
  __mpz_struct local_88;
  Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_> local_78;
  __mpz_struct local_58;
  AnyPoly local_48;
  
  pEVar10 = (this->_memo)._memo._entries;
  pEVar1 = (this->_memo)._memo._afterLast;
  local_100 = 0;
  local_d8 = (RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
              *)__return_storage_ptr__;
  if (pEVar10 != pEVar1) {
    uVar9 = (long)pEVar1 - (long)pEVar10 >> 5;
    lVar4 = 0x3f;
    if (uVar9 != 0) {
      for (; uVar9 >> lVar4 == 0; lVar4 = lVar4 + -1) {
      }
    }
    std::
    __introsort_loop<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>>*,long,__gnu_cxx::__ops::_Iter_less_iter>
              (pEVar10,pEVar1,((uint)lVar4 ^ 0x3f) * 2 ^ 0x7e,
               CONCAT71(in_register_00000009,removeZeros));
    std::
    __final_insertion_sort<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>>*,__gnu_cxx::__ops::_Iter_less_iter>
              (pEVar10,pEVar1);
    pEVar10 = (this->_memo)._memo._entries;
    if ((this->_memo)._memo._afterLast != pEVar10) {
      uVar9 = 0;
      local_100 = 0;
      do {
        Kernel::IntegerConstantType::IntegerConstantType
                  ((IntegerConstantType *)&local_f8,
                   (IntegerConstantType *)(&pEVar10->code + uVar9 * 8));
        local_f8._summands._cursor =
             (Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)
             CONCAT44(local_f8._summands._cursor._4_4_,
                      *(undefined4 *)((long)&pEVar10->_key + uVar9 * 0x20 + 0xc));
        local_f8._summands._end =
             *(Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> **)
              ((long)&pEVar10->_key + uVar9 * 0x20 + 0x14);
        Kernel::IntegerConstantType::IntegerConstantType
                  ((IntegerConstantType *)&local_58,(IntegerConstantType *)&local_f8);
        iVar5 = (int)local_f8._summands._cursor;
        local_d0 = local_f8._summands._end;
        uVar9 = (ulong)((int)uVar9 + 1);
        pEVar10 = (this->_memo)._memo._entries;
        if (uVar9 < (ulong)((long)(this->_memo)._memo._afterLast - (long)pEVar10 >> 5)) {
          do {
            if (*(int *)((long)&pEVar10->_key + uVar9 * 0x20 + 0xc) != iVar5) break;
            Kernel::IntegerConstantType::operator+
                      ((IntegerConstantType *)&local_c8,(IntegerConstantType *)&local_58);
            mpz_swap(&local_58,&local_c8);
            mpz_clear(&local_c8);
            uVar9 = (ulong)((int)uVar9 + 1);
            pEVar10 = (this->_memo)._memo._entries;
          } while (uVar9 < (ulong)((long)(this->_memo)._memo._afterLast - (long)pEVar10 >> 5));
        }
        local_fc = (char)summands;
        if (local_fc == '\0') {
LAB_004f737e:
          Kernel::IntegerConstantType::IntegerConstantType
                    ((IntegerConstantType *)&local_88,(IntegerConstantType *)&local_58);
          Kernel::IntegerConstantType::IntegerConstantType
                    ((IntegerConstantType *)&local_c8,(IntegerConstantType *)&local_88);
          local_b8 = iVar5;
          pMStack_b0 = local_d0;
          u = (__mpz_struct *)(&((this->_memo)._memo._entries)->code + (long)local_100 * 8);
          mpz_swap(u,&local_c8);
          u[1]._mp_alloc = local_b8;
          u[1]._mp_size = uStack_b4;
          u[1]._mp_d = (mp_limb_t *)pMStack_b0;
          mpz_clear(&local_c8);
          mpz_clear(&local_88);
          local_100 = local_100 + 1;
        }
        else {
          Kernel::IntegerConstantType::IntegerConstantType((IntegerConstantType *)&local_c8,0);
          iVar8 = mpz_cmp(&local_58,&local_c8);
          mpz_clear(&local_c8);
          if (iVar8 != 0) goto LAB_004f737e;
        }
        mpz_clear(&local_58);
        mpz_clear((__mpz_struct *)&local_f8);
        pEVar10 = (this->_memo)._memo._entries;
      } while (uVar9 < (ulong)((long)(this->_memo)._memo._afterLast - (long)pEVar10 >> 5));
    }
  }
  for (pEVar10 = (Entry *)(&pEVar10->code + (long)local_100 * 8);
      pEVar10 != (this->_memo)._memo._afterLast; pEVar10 = (Entry *)((pEVar10->_value).__data + 4))
  {
    mpz_clear((__mpz_struct *)pEVar10);
  }
  pEVar10 = (this->_memo)._memo._entries;
  (this->_memo)._memo._afterLast = (Entry *)((__mpz_struct *)&pEVar10->code + (long)local_100 * 2);
  if (local_100 == 1) {
    Kernel::IntegerConstantType::IntegerConstantType
              ((IntegerConstantType *)&local_98,(IntegerConstantType *)pEVar10);
    local_f8._summands._capacity = CONCAT44(local_f8._summands._capacity._4_4_,1);
    bVar7 = Kernel::operator==((IntegerConstantType *)&local_98,(int *)&local_f8);
    if ((bVar7) &&
       (lVar4 = *(long *)((long)&((this->_memo)._memo._entries)->_key + 0x14),
       lVar2 = *(long *)(lVar4 + 8),
       (int)((ulong)(*(long *)(lVar4 + 0x10) - lVar2) >> 2) * -0x49249249 == 1)) {
      bVar7 = *(int *)(lVar2 + 0x18) == 1;
    }
    else {
      bVar7 = false;
    }
    mpz_clear(&local_98);
    pRVar6 = local_d8;
    if (bVar7) {
      pDVar3 = *(DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
                 **)(*(long *)((long)&((this->_memo)._memo._entries)->_key + 0x14) + 8);
      *(undefined8 *)local_d8 = 0;
      *(undefined8 *)(local_d8 + 8) = 0;
      *(undefined8 *)(local_d8 + 0x10) = 0;
      *local_d8 = (RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
                   )(*(byte *)&(pDVar3->
                               super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                               ).
                               super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                    & 3);
      f.other = pDVar3;
      f.this = (DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
                *)local_d8;
      Lib::CoproductImpl::
      RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
      ::
      switchN<Lib::CoproductImpl::TrivialOperations::CopyCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>>>::DefaultImpl(Lib::CoproductImpl::TrivialOperations::CopyCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>>>const&)::_lambda(auto:1)_1_>
                (local_d8,f);
      return (PolyNf *)pRVar6;
    }
  }
  Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>::Polynom
            (&local_f8,
             (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> *)this);
  local_78._summands._capacity = local_f8._summands._capacity;
  local_f8._summands._capacity = 0;
  local_78._summands._end = local_f8._summands._end;
  local_f8._summands._end = (Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)0x0;
  local_78._summands._stack = local_f8._summands._stack;
  local_78._summands._cursor = local_f8._summands._cursor;
  local_f8._summands._stack = (Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)0x0;
  local_f8._summands._cursor = (Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)0x0;
  Lib::
  perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Lib::PerfectIdComparison>
            ((Lib *)local_a8,&local_78);
  pRVar6 = local_d8;
  local_48.super_AnyPolySuper._inner.
  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
  .
  super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
  ._content[7] = '\0';
  local_48.super_AnyPolySuper._inner.
  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
  .
  super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
  ._0_8_ = (ulong)local_a8[0] << 8;
  local_48.super_AnyPolySuper._inner.
  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
  .
  super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
  ._content._8_7_ = SUB87(local_a8._8_8_,0);
  local_48.super_AnyPolySuper._inner.
  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
  .
  super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
  ._content[0xf] = SUB81(local_a8._8_8_,7);
  local_48.super_AnyPolySuper._inner.
  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
  .
  super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
  ._17_3_ = 0;
  Kernel::PolyNf::PolyNf((PolyNf *)local_d8,&local_48);
  r = local_78._summands._cursor;
  while (r != local_78._summands._stack) {
    r = r + -1;
    mpz_clear((__mpz_struct *)r);
  }
  pMVar11 = local_f8._summands._cursor;
  if (r != (Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)0x0) {
    uVar9 = local_78._summands._capacity << 5;
    if (uVar9 == 0) {
      ((local_78._summands._stack)->numeral)._val[0]._mp_alloc =
           Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_4_;
      ((local_78._summands._stack)->numeral)._val[0]._mp_size =
           Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._20_4_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_78._summands._stack;
    }
    else if (uVar9 < 0x21) {
      ((local_78._summands._stack)->numeral)._val[0]._mp_alloc =
           Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_4_;
      ((local_78._summands._stack)->numeral)._val[0]._mp_size =
           Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._92_4_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_78._summands._stack;
    }
    else if (uVar9 < 0x31) {
      ((local_78._summands._stack)->numeral)._val[0]._mp_alloc =
           Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_4_;
      ((local_78._summands._stack)->numeral)._val[0]._mp_size =
           Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._116_4_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_78._summands._stack;
    }
    else if (uVar9 < 0x41) {
      ((local_78._summands._stack)->numeral)._val[0]._mp_alloc =
           Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_4_;
      ((local_78._summands._stack)->numeral)._val[0]._mp_size =
           Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._140_4_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_78._summands._stack;
    }
    else {
      operator_delete(local_78._summands._stack,0x10);
      pMVar11 = local_f8._summands._cursor;
    }
  }
  while (pMVar11 != local_f8._summands._stack) {
    mpz_clear((__mpz_struct *)(pMVar11 + -1));
    pMVar11 = pMVar11 + -1;
  }
  if (pMVar11 != (Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)0x0) {
    uVar9 = local_f8._summands._capacity << 5;
    if (uVar9 == 0) {
      ((local_f8._summands._stack)->numeral)._val[0]._mp_alloc =
           Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_4_;
      ((local_f8._summands._stack)->numeral)._val[0]._mp_size =
           Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._20_4_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_f8._summands._stack;
    }
    else if (uVar9 < 0x21) {
      ((local_f8._summands._stack)->numeral)._val[0]._mp_alloc =
           Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_4_;
      ((local_f8._summands._stack)->numeral)._val[0]._mp_size =
           Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._92_4_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_f8._summands._stack;
    }
    else if (uVar9 < 0x31) {
      ((local_f8._summands._stack)->numeral)._val[0]._mp_alloc =
           Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_4_;
      ((local_f8._summands._stack)->numeral)._val[0]._mp_size =
           Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._116_4_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_f8._summands._stack;
    }
    else if (uVar9 < 0x41) {
      ((local_f8._summands._stack)->numeral)._val[0]._mp_alloc =
           Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_4_;
      ((local_f8._summands._stack)->numeral)._val[0]._mp_size =
           Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._140_4_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_f8._summands._stack;
    }
    else {
      operator_delete(local_f8._summands._stack,0x10);
    }
  }
  return (PolyNf *)pRVar6;
}

Assistant:

PolyNf PolynomialEvaluation::simplifySummation(Stack<Monom<Number>> summands, bool removeZeros)
{ 
  using Monom   = Monom<Number>;
  using Polynom = Polynom<Number>;

  // then we sort them by their monom, in order to add up the coefficients efficiently
  std::sort(summands.begin(), summands.end());

  // add up the coefficients (in place)
  {
    auto offs = 0;
    for (unsigned i = 0; i < summands.size(); i++) { 
      auto monom = summands[i];
      auto numeral = monom.numeral;
      auto factors = monom.factors;
      while ( i + 1 < summands.size() && summands[i+1].factors == factors ) {
        numeral = numeral + summands[i+1].numeral;
        i++;
      }
      if (!removeZeros || numeral != Number::constant(0)) 
        summands[offs++] = Monom(numeral, factors);
    }
    summands.truncate(offs);
  }

  if (summands.size() == 1 
      && summands[0].numeral == 1
      && summands[0].factors->nFactors() == 1
      && summands[0].factors->factorAt(0).power == 1
      ) {
    return summands[0].factors->factorAt(0).term;
  } else {
    auto poly = Polynom(std::move(summands));
    poly.integrity();
    return PolyNf(AnyPoly(perfect(std::move(poly))));
  }
}